

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O3

int __thiscall
BattleWithLandlord::AlphaBeta
          (BattleWithLandlord *this,int depth,int alpha,int beta,
          list<CardStyle,_std::allocator<CardStyle>_> *pv)

{
  size_t *psVar1;
  CardStyle *last_00;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__x;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__x_00;
  int iVar2;
  int iVar3;
  int iVar4;
  _Node *p_Var5;
  undefined4 in_register_00000034;
  CardStyle *s;
  pointer __args;
  list<CardStyle,_std::allocator<CardStyle>_> line;
  vector<CardStyle,_std::allocator<CardStyle>_> strategies;
  CardStyle last;
  _List_base<CardStyle,_std::allocator<CardStyle>_> local_b0;
  vector<CardStyle,_std::allocator<CardStyle>_> local_98;
  CardStyle *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_68;
  
  iVar4 = 0;
  if (this->_stopsearch == false) {
    last_00 = &this->_last;
    GenStrategy(&local_98,(BattleWithLandlord *)CONCAT44(in_register_00000034,depth),
                this->_cards + this->_side,last_00);
    if (((this->_cards[this->_side]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
        (*(long *)((long)this + (1 - (long)this->_side) * 0x30 + 0x98) == 0)) ||
       ((depth < 1 &&
        (0x40 < (ulong)((long)local_98.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>.
                             _M_impl.super__Vector_impl_data._M_start))))) {
      iVar3 = Evaluate(this);
      iVar4 = -iVar3;
      if (this->_side == 0) {
        iVar4 = iVar3;
      }
    }
    else {
      local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
      local_b0._M_impl._M_node._M_size = 0;
      local_78._0_4_ = last_00->type;
      local_78._4_4_ = last_00->id;
      uStack_70._0_4_ = (this->_last).len;
      uStack_70._4_4_ = (this->_last).carry;
      __x = &(this->_last).pattern;
      local_b0._M_impl._M_node.super__List_node_base._M_prev =
           local_b0._M_impl._M_node.super__List_node_base._M_next;
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      _Rb_tree(&local_68,&__x->_M_t);
      local_80 = local_98.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_98.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __args = local_98.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          __x_00 = &__args->pattern;
          Move(this,__x_00);
          iVar4 = __args->id;
          iVar3 = __args->len;
          iVar2 = __args->carry;
          last_00->type = __args->type;
          last_00->id = iVar4;
          (this->_last).len = iVar3;
          (this->_last).carry = iVar2;
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          operator=(&__x->_M_t,&__x_00->_M_t);
          iVar4 = AlphaBeta(this,depth + -1,-beta,-alpha,
                            (list<CardStyle,_std::allocator<CardStyle>_> *)&local_b0);
          Unmove(this,__x_00);
          iVar3 = -iVar4;
          if (beta < iVar3) goto LAB_0010a1c5;
          if (SBORROW4(alpha,iVar3) != alpha + iVar4 < 0) {
            if (&local_b0 != &pv->super__List_base<CardStyle,_std::allocator<CardStyle>_>) {
              std::__cxx11::list<CardStyle,std::allocator<CardStyle>>::
              _M_assign_dispatch<std::_List_const_iterator<CardStyle>>
                        ((list<CardStyle,std::allocator<CardStyle>> *)pv,
                         local_b0._M_impl._M_node.super__List_node_base._M_next,&local_b0);
            }
            p_Var5 = std::__cxx11::list<CardStyle,std::allocator<CardStyle>>::
                     _M_create_node<CardStyle_const&>
                               ((list<CardStyle,std::allocator<CardStyle>> *)pv,__args);
            std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
            psVar1 = &(pv->super__List_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl._M_node.
                      _M_size;
            *psVar1 = *psVar1 + 1;
            alpha = iVar3;
          }
        } while ((alpha < 0x7149) && (__args = __args + 1, __args != local_80));
      }
      last_00->type = (undefined4)local_78;
      last_00->id = local_78._4_4_;
      (this->_last).len = (undefined4)uStack_70;
      (this->_last).carry = uStack_70._4_4_;
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      operator=(&__x->_M_t,&local_68);
      beta = alpha;
LAB_0010a1c5:
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&local_68);
      std::__cxx11::_List_base<CardStyle,_std::allocator<CardStyle>_>::_M_clear(&local_b0);
      iVar4 = beta;
    }
    std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector(&local_98);
  }
  return iVar4;
}

Assistant:

int BattleWithLandlord::AlphaBeta(int depth, int alpha, int beta, list<CardStyle> &pv) {
    {
        // std::lock_guard<std::mutex> lck(_mtx);
        if (_stopsearch) return 0;
    }

#if USE_HASHMAP
    if (_hash.find(_cards[_side], _cards[1-_side], _last, depth)) {
        auto val = _hash.get();
        pv = val.path;
        return val.score;
        // else continue alpha-beta search
    }
#endif

    auto strategies = GenStrategy();

    if (!_cards[_side].size() || !_cards[1-_side].size() || 
        depth <= 0 && strategies.size() > 1) {
        
        auto v = Evaluate();
        int score = _side ? -v: v;
        return score;
    }

    int value;
    list<CardStyle> line;


    CardStyle last = _last;
    for (auto &s: strategies) {
        Move(s.pattern);
        _last = s;
        value = -AlphaBeta(depth-1, -beta, -alpha, line);
        Unmove(s.pattern);

        if (value > beta) {
            return beta;
        }
        if (value > alpha) {
            alpha = value;
            pv = line;
            pv.push_front(s);
        }
// #if !USE_HASHMAP
        if (alpha > WIN_SCORE) break;
// #endif
    }
#if USE_HASHMAP
    if (depth == _max_depth && (alpha > WIN_SCORE || alpha < -WIN_SCORE )) {
        _hash.put(_cards[_side], _cards[1-_side], last, pv, depth, alpha);
    } 
#endif

    _last = last;
    return alpha; 
}